

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O1

size_t __thiscall
Assimp::IFC::anon_unknown_9::PolyLine::EstimateSampleCount(PolyLine *this,IfcFloat a,IfcFloat b)

{
  int iVar1;
  ulong uVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  double dVar4;
  IfcFloat IVar5;
  
  IVar5 = b;
  (*(this->super_BoundedCurve).super_Curve._vptr_Curve[5])();
  dVar3 = IVar5;
  iVar1 = (*(this->super_BoundedCurve).super_Curve._vptr_Curve[2])(this);
  if (((char)iVar1 != '\0') ||
     ((-1.1920928955078125e-07 < a - extraout_XMM0_Qa && (-1.1920928955078125e-07 < IVar5 - a)))) {
    (*(this->super_BoundedCurve).super_Curve._vptr_Curve[5])(this);
    iVar1 = (*(this->super_BoundedCurve).super_Curve._vptr_Curve[2])(this);
    if (((char)iVar1 != '\0') ||
       ((-1.1920928955078125e-07 < b - extraout_XMM0_Qa_00 && (-1.1920928955078125e-07 < dVar3 - b))
       )) {
      dVar3 = ceil(b);
      dVar4 = floor(a);
      uVar2 = (ulong)(dVar3 - dVar4);
      return (long)((dVar3 - dVar4) - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
    }
  }
  __assert_fail("InRange(a) && InRange(b)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                ,0x1c1,
                "virtual size_t Assimp::IFC::(anonymous namespace)::PolyLine::EstimateSampleCount(IfcFloat, IfcFloat) const"
               );
}

Assistant:

size_t EstimateSampleCount(IfcFloat a, IfcFloat b) const {
        ai_assert(InRange(a) && InRange(b));
        return static_cast<size_t>( std::ceil(b) - std::floor(a) );
    }